

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O2

mat<double,_3,_3> * __thiscall
linalg::inverse<double,3>
          (mat<double,_3,_3> *__return_storage_ptr__,linalg *this,mat<double,_3,_3> *a)

{
  apply<linalg::detail::op_div,void,linalg::mat<double,3,3>,double> local_60 [72];
  
  adjugate<double>((mat<double,_3,_3> *)this);
  determinant<double>((mat<double,_3,_3> *)this);
  detail::apply<linalg::detail::op_div,void,linalg::mat<double,3,3>,double>::impl<0,1,2>
            (__return_storage_ptr__,local_60);
  return __return_storage_ptr__;
}

Assistant:

constexpr mat<T,N,N> inverse(const mat<T,N,N> & a) { return adjugate(a)/determinant(a); }